

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptWeakMap>::GetChildren
          (RecyclableCollectionObjectWalker<Js::JavascriptWeakMap> *this)

{
  int iVar1;
  RecyclableObject *key;
  int i;
  bool bVar2;
  JavascriptWeakMap *this_00;
  Type *this_01;
  RecyclableObject *pRVar3;
  WeakMapKeyMap *this_02;
  int last;
  long lVar4;
  ulong uVar5;
  RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap> local_50;
  Var local_40;
  Var value;
  
  this_00 = VarTo<Js::JavascriptWeakMap>(this->instance);
  this_01 = &this_00->keySet;
  pRVar3 = (RecyclableObject *)((ulong)this_00 | 1);
  value = this_00;
  for (uVar5 = 0;
      uVar5 < (this_00->keySet).
              super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
              .bucketCount; uVar5 = uVar5 + 1) {
    iVar1 = (this_00->keySet).
            super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            .buckets.ptr[uVar5];
    if (iVar1 != -1) {
      last = -1;
      while (i = iVar1, i != -1) {
        lVar4 = (long)i;
        key = (this_00->keySet).
              super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
              .weakRefs.ptr[lVar4].ptr;
        if (key == (RecyclableObject *)0x0) {
          iVar1 = (this_00->keySet).
                  super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  .entries.ptr[lVar4].super_ValueEntryData<bool>.next;
          JsUtil::
          SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          ::RemoveAt(&this_01->
                      super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                     ,i,last,(uint)uVar5);
          this_00 = (JavascriptWeakMap *)value;
        }
        else {
          local_40 = (Var)0x0;
          this_02 = JavascriptWeakMap::GetWeakMapKeyMapFromKey(this_00,key);
          if ((this_02 != (WeakMapKeyMap *)0x0) &&
             (local_50.key = pRVar3,
             bVar2 = JsUtil::
                     BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     ::ContainsKey(this_02,&local_50.key), bVar2)) {
            JavascriptWeakMap::KeyMapGet((JavascriptWeakMap *)value,this_02,&local_40);
            local_50.value = local_40;
            local_50.key = key;
            JsUtil::
            List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Add(this->propertyList,&local_50);
          }
          this_00 = (JavascriptWeakMap *)value;
          iVar1 = *(int *)(*(long *)((long)value + 0x30) + 4 + lVar4 * 8);
          last = i;
        }
      }
    }
  }
  return;
}

Assistant:

void RecyclableCollectionObjectWalker<JavascriptWeakMap>::GetChildren()
    {
        JavascriptWeakMap* data = VarTo<JavascriptWeakMap>(instance);
        data->Map([&](Var key, Var value)
        {
            propertyList->Add(RecyclableCollectionObjectWalkerPropertyData<JavascriptWeakMap>(key, value));
        });
    }